

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseGenerateBlock(Parser *this)

{
  Token colon;
  Token semi;
  Token name_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> elements;
  Token begin_00;
  Token end_00;
  bool bVar1;
  EmptyMemberSyntax *pEVar2;
  NamedBlockClauseSyntax *pNVar3;
  NamedBlockClauseSyntax *label_00;
  GenerateBlockSyntax *pGVar4;
  Info *in_RDI;
  NamedBlockClauseSyntax *endName;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token end;
  NamedBlockClauseSyntax *beginName;
  Token begin;
  Token name;
  SourceLocation loc;
  MemberSyntax *member;
  NamedLabelSyntax *label;
  ParserBase *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  TokenKind in_stack_fffffffffffffda6;
  undefined4 in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdac;
  TokenKind in_stack_fffffffffffffdae;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdb0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffdb8;
  ParserBase *in_stack_fffffffffffffdc0;
  Info *this_00;
  NamedLabelSyntax *pNVar5;
  ParserBase *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  Parser *in_stack_fffffffffffffdf8;
  ParserBase *in_stack_fffffffffffffe00;
  SourceLocation in_stack_fffffffffffffe08;
  NamedBlockClauseSyntax *in_stack_fffffffffffffe10;
  DiagCode code;
  NamedBlockClauseSyntax *in_stack_fffffffffffffe18;
  Parser *in_stack_fffffffffffffe20;
  NamedBlockClauseSyntax *local_148;
  NamedBlockClauseSyntax *local_140;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff80;
  SyntaxKind in_stack_ffffffffffffff8c;
  Token *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  TokenKind endKind;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Token local_58;
  SourceLocation local_48;
  MemberSyntax *local_40;
  Token local_38;
  Token local_28;
  NamedLabelSyntax *local_18;
  
  endKind = (TokenKind)((ulong)in_stack_ffffffffffffff98 >> 0x30);
  local_18 = (NamedLabelSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdb0._M_extent_value,
                           in_stack_fffffffffffffdae);
  if (!bVar1) {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdb0._M_extent_value,
                             in_stack_fffffffffffffdae);
    in_stack_fffffffffffffdef = true;
    if (bVar1) {
      local_28 = ParserBase::peek((ParserBase *)
                                  CONCAT26(in_stack_fffffffffffffdae,
                                           CONCAT24(in_stack_fffffffffffffdac,
                                                    in_stack_fffffffffffffda8)),
                                  CONCAT22(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4));
      in_stack_fffffffffffffdef = true;
      if (local_28.kind == Colon) {
        local_38 = ParserBase::peek((ParserBase *)
                                    CONCAT26(in_stack_fffffffffffffdae,
                                             CONCAT24(in_stack_fffffffffffffdac,
                                                      in_stack_fffffffffffffda8)),
                                    CONCAT22(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4));
        in_stack_fffffffffffffdef = local_38.kind != BeginKeyword;
      }
    }
    if ((bool)in_stack_fffffffffffffdef != false) {
      local_40 = parseSingleMember((Parser *)in_stack_fffffffffffffdb0._M_extent_value,
                                   CONCAT22(in_stack_fffffffffffffdae,in_stack_fffffffffffffdac));
      code = SUB84((ulong)in_stack_fffffffffffffe10 >> 0x20,0);
      if (local_40 != (MemberSyntax *)0x0) {
        return local_40;
      }
      local_58 = ParserBase::peek(in_stack_fffffffffffffd98);
      local_48 = Token::location(&local_58);
      bVar1 = ParserBase::haveDiagAtCurrentLoc(in_stack_fffffffffffffde0);
      if (!bVar1) {
        ParserBase::addDiag(in_stack_fffffffffffffe00,code,in_stack_fffffffffffffe08);
      }
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 in_stack_fffffffffffffdb0._M_extent_value,
                 (nullptr_t)
                 CONCAT26(in_stack_fffffffffffffdae,
                          CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)));
      slang::syntax::TokenList::TokenList
                ((TokenList *)in_stack_fffffffffffffdb0._M_extent_value,
                 (nullptr_t)
                 CONCAT26(in_stack_fffffffffffffdae,
                          CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)));
      ParserBase::missingToken
                ((ParserBase *)
                 CONCAT26(in_stack_fffffffffffffdae,
                          CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)),
                 in_stack_fffffffffffffda6,(SourceLocation)in_stack_fffffffffffffdb0._M_extent_value
                );
      semi.rawLen._0_2_ = in_stack_fffffffffffffdac;
      semi.kind = (short)in_stack_fffffffffffffda8;
      semi._2_1_ = (char)((uint)in_stack_fffffffffffffda8 >> 0x10);
      semi.numFlags.raw = (char)((uint)in_stack_fffffffffffffda8 >> 0x18);
      semi.rawLen._2_2_ = in_stack_fffffffffffffdae;
      semi.info = (Info *)in_stack_fffffffffffffdb0._M_extent_value;
      pEVar2 = slang::syntax::SyntaxFactory::emptyMember
                         ((SyntaxFactory *)
                          CONCAT26(in_stack_fffffffffffffda6,
                                   CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                          in_stack_fffffffffffffd98,(TokenList *)0x898931,semi);
      return &pEVar2->super_MemberSyntax;
    }
    ParserBase::consume(in_stack_fffffffffffffdc0);
    ParserBase::consume(in_stack_fffffffffffffdc0);
    name_00.rawLen._0_2_ = in_stack_fffffffffffffdac;
    name_00.kind = (short)in_stack_fffffffffffffda8;
    name_00._2_1_ = (char)((uint)in_stack_fffffffffffffda8 >> 0x10);
    name_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffda8 >> 0x18);
    name_00.rawLen._2_2_ = in_stack_fffffffffffffdae;
    name_00.info = (Info *)in_stack_fffffffffffffdb0._M_extent_value;
    colon.info._0_4_ = in_stack_fffffffffffffda0;
    colon._0_8_ = in_stack_fffffffffffffd98;
    colon.info._4_2_ = in_stack_fffffffffffffda4;
    colon.info._6_2_ = in_stack_fffffffffffffda6;
    local_18 = slang::syntax::SyntaxFactory::namedLabel((SyntaxFactory *)0x8989ca,name_00,colon);
  }
  ParserBase::consume(in_stack_fffffffffffffdc0);
  pNVar3 = parseNamedBlockClause(in_stack_fffffffffffffdf8);
  Token::Token((Token *)CONCAT26(in_stack_fffffffffffffda6,
                                 CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
  parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseGenerateBlock()::__0>
            ((Parser *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),endKind,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
  label_00 = parseNamedBlockClause(in_stack_fffffffffffffdf8);
  checkBlockNames(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                  (NamedLabelSyntax *)in_stack_fffffffffffffe08);
  this_00 = in_RDI + 0xe;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             in_stack_fffffffffffffdb0._M_extent_value,
             (nullptr_t)
             CONCAT26(in_stack_fffffffffffffdae,
                      CONCAT24(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)));
  elements._M_ptr._4_2_ = in_stack_fffffffffffffdac;
  elements._M_ptr._0_4_ = in_stack_fffffffffffffda8;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffdae;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffdb0._M_extent_value;
  pNVar5 = local_18;
  slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::MemberSyntax> *)
             CONCAT26(in_stack_fffffffffffffda6,
                      CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),elements);
  begin_00.info = (Info *)pNVar3;
  begin_00._0_8_ = pNVar5;
  end_00.rawLen._3_1_ = in_stack_fffffffffffffdef;
  end_00._0_7_ = in_stack_fffffffffffffde8;
  end_00.info = in_RDI;
  pGVar4 = slang::syntax::SyntaxFactory::generateBlock
                     ((SyntaxFactory *)this_00,in_stack_fffffffffffffdb8,
                      (NamedLabelSyntax *)label_00,begin_00,local_140,
                      (SyntaxList<slang::syntax::MemberSyntax> *)in_stack_fffffffffffffde0,end_00,
                      local_148);
  return &pGVar4->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseGenerateBlock() {
    NamedLabelSyntax* label = nullptr;
    if (!peek(TokenKind::BeginKeyword)) {
        if (!peek(TokenKind::Identifier) || peek(1).kind != TokenKind::Colon ||
            peek(2).kind != TokenKind::BeginKeyword) {
            // This is just a single member instead of a block.
            auto member = parseSingleMember(SyntaxKind::GenerateBlock);
            if (member)
                return *member;

            // If there was some syntax error that caused parseMember to return null, fabricate an
            // empty member here and let our caller sort it out.
            auto loc = peek().location();
            if (!haveDiagAtCurrentLoc())
                addDiag(diag::ExpectedMember, loc);
            return factory.emptyMember(nullptr, nullptr, missingToken(TokenKind::Semicolon, loc));
        }

        auto name = consume();
        label = &factory.namedLabel(name, consume());
    }

    auto begin = consume();
    auto beginName = parseNamedBlockClause();

    Token end;
    auto members =
        parseMemberList<MemberSyntax>(TokenKind::EndKeyword, end, SyntaxKind::GenerateBlock,
                                      [this](SyntaxKind parentKind, bool& anyLocalModules) {
                                          return parseMember(parentKind, anyLocalModules);
                                      });

    auto endName = parseNamedBlockClause();
    checkBlockNames(beginName, endName, label);

    return factory.generateBlock(nullptr, // never any attributes
                                 label, begin, beginName, members, end, endName);
}